

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# snapshot_sync_ctx.cxx
# Opt level: O0

bool __thiscall
nuraft::snapshot_io_mgr::has_pending_request(snapshot_io_mgr *this,raft_server *r,int srv_id)

{
  bool bVar1;
  int32 iVar2;
  element_type *this_00;
  element_type *peVar3;
  int in_EDX;
  element_type *in_RSI;
  lock_guard<std::mutex> *in_RDI;
  shared_ptr<nuraft::snapshot_io_mgr::io_queue_elem> *entry;
  iterator __end1;
  iterator __begin1;
  list<std::shared_ptr<nuraft::snapshot_io_mgr::io_queue_elem>,_std::allocator<std::shared_ptr<nuraft::snapshot_io_mgr::io_queue_elem>_>_>
  *__range1;
  lock_guard<std::mutex> guard;
  undefined4 in_stack_ffffffffffffff98;
  undefined4 in_stack_ffffffffffffff9c;
  _Self local_40;
  _Self local_38;
  lock_guard<std::mutex> *local_30;
  int local_1c;
  element_type *local_18;
  byte local_1;
  
  local_1c = in_EDX;
  local_18 = in_RSI;
  std::lock_guard<std::mutex>::lock_guard
            (in_RDI,(mutex_type *)CONCAT44(in_stack_ffffffffffffff9c,in_stack_ffffffffffffff98));
  local_30 = in_RDI + 4;
  local_38._M_node =
       (_List_node_base *)
       std::__cxx11::
       list<std::shared_ptr<nuraft::snapshot_io_mgr::io_queue_elem>,_std::allocator<std::shared_ptr<nuraft::snapshot_io_mgr::io_queue_elem>_>_>
       ::begin((list<std::shared_ptr<nuraft::snapshot_io_mgr::io_queue_elem>,_std::allocator<std::shared_ptr<nuraft::snapshot_io_mgr::io_queue_elem>_>_>
                *)CONCAT44(in_stack_ffffffffffffff9c,in_stack_ffffffffffffff98));
  local_40._M_node =
       (_List_node_base *)
       std::__cxx11::
       list<std::shared_ptr<nuraft::snapshot_io_mgr::io_queue_elem>,_std::allocator<std::shared_ptr<nuraft::snapshot_io_mgr::io_queue_elem>_>_>
       ::end((list<std::shared_ptr<nuraft::snapshot_io_mgr::io_queue_elem>,_std::allocator<std::shared_ptr<nuraft::snapshot_io_mgr::io_queue_elem>_>_>
              *)CONCAT44(in_stack_ffffffffffffff9c,in_stack_ffffffffffffff98));
  do {
    bVar1 = std::operator!=(&local_38,&local_40);
    if (!bVar1) {
      local_1 = 0;
LAB_00287b8b:
      std::lock_guard<std::mutex>::~lock_guard((lock_guard<std::mutex> *)0x287b95);
      return (bool)(local_1 & 1);
    }
    std::_List_iterator<std::shared_ptr<nuraft::snapshot_io_mgr::io_queue_elem>_>::operator*
              ((_List_iterator<std::shared_ptr<nuraft::snapshot_io_mgr::io_queue_elem>_> *)0x287af8)
    ;
    this_00 = std::
              __shared_ptr_access<nuraft::snapshot_io_mgr::io_queue_elem,_(__gnu_cxx::_Lock_policy)2,_false,_false>
              ::operator->((__shared_ptr_access<nuraft::snapshot_io_mgr::io_queue_elem,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                            *)0x287b07);
    peVar3 = std::__shared_ptr<nuraft::raft_server,_(__gnu_cxx::_Lock_policy)2>::get
                       ((__shared_ptr<nuraft::raft_server,_(__gnu_cxx::_Lock_policy)2> *)this_00);
    if (peVar3 == local_18) {
      std::
      __shared_ptr_access<nuraft::snapshot_io_mgr::io_queue_elem,_(__gnu_cxx::_Lock_policy)2,_false,_false>
      ::operator->((__shared_ptr_access<nuraft::snapshot_io_mgr::io_queue_elem,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                    *)0x287b20);
      std::__shared_ptr_access<nuraft::peer,_(__gnu_cxx::_Lock_policy)2,_false,_false>::operator->
                ((__shared_ptr_access<nuraft::peer,_(__gnu_cxx::_Lock_policy)2,_false,_false> *)
                 0x287b2c);
      iVar2 = peer::get_id((peer *)0x287b34);
      if (iVar2 == local_1c) {
        local_1 = 1;
        goto LAB_00287b8b;
      }
    }
    std::_List_iterator<std::shared_ptr<nuraft::snapshot_io_mgr::io_queue_elem>_>::operator++
              (&local_38);
  } while( true );
}

Assistant:

bool snapshot_io_mgr::has_pending_request(raft_server* r, int srv_id) {
    auto_lock(queue_lock_);
    for (auto& entry: queue_) {
        if ( entry->raft_.get() == r &&
             entry->dst_->get_id() == srv_id ) {
            return true;
        }
    }
    return false;
}